

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O3

int PSolveB(sunrealtype t,N_Vector c,N_Vector cB,N_Vector fcB,N_Vector r,N_Vector z,
           sunrealtype gamma,sunrealtype delta,int lr,void *user_data)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  
  N_VScale(0x3ff0000000000000,r,z);
  GSIter(-gamma,z,*(N_Vector *)((long)user_data + 0x9940),(WebData)user_data);
  iVar1 = *(int *)((long)user_data + 0x54);
  if (0 < (long)iVar1) {
    iVar2 = *(int *)((long)user_data + 0x5c);
    uVar3 = *(uint *)((long)user_data + 0x50);
    iVar4 = *(int *)((long)user_data + 0x48);
    lVar9 = 0;
    iVar12 = 0;
    do {
      if (0 < (int)uVar3) {
        iVar5 = *(int *)((long)user_data + lVar9 * 4 + 0xd0);
        lVar11 = (long)iVar12 * 8;
        iVar12 = iVar12 + iVar4 * uVar3;
        uVar10 = 0;
        do {
          lVar8 = (long)*(int *)((long)user_data + uVar10 * 4 + 0x80) + (long)iVar5 * (long)iVar2;
          uVar6 = *(undefined8 *)((long)user_data + lVar8 * 8);
          uVar7 = *(undefined8 *)((long)user_data + lVar8 * 8 + 0x20);
          lVar8 = N_VGetArrayPointer(z);
          SUNDlsMat_denseGETRS(uVar6,(long)iVar4,uVar7,lVar8 + lVar11);
          uVar10 = uVar10 + 1;
          lVar11 = lVar11 + (long)iVar4 * 8;
        } while (uVar3 != uVar10);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar1);
  }
  return 0;
}

Assistant:

static int PSolveB(sunrealtype t, N_Vector c, N_Vector cB, N_Vector fcB,
                   N_Vector r, N_Vector z, sunrealtype gamma, sunrealtype delta,
                   int lr, void* user_data)
{
  sunrealtype*** P;
  sunindextype** pivot;
  int jx, jy, igx, igy, iv, ig, *jigx, *jigy, mx, my, ngx, mp;
  WebData wdata;

  wdata = (WebData)user_data;

  N_VScale(ONE, r, z);

  /* call GSIter for Gauss-Seidel iterations (same routine but with gamma=-gamma) */

  GSIter(-gamma, z, wdata->vtempB, wdata);

  /* Do backsolves for inverse of block-diagonal preconditioner factor */

  P     = wdata->P;
  pivot = wdata->pivot;
  mx    = wdata->mx;
  my    = wdata->my;
  ngx   = wdata->ngx;
  mp    = wdata->mp;
  jigx  = wdata->jigx;
  jigy  = wdata->jigy;

  iv = 0;
  for (jy = 0; jy < my; jy++)
  {
    igy = jigy[jy];
    for (jx = 0; jx < mx; jx++)
    {
      igx = jigx[jx];
      ig  = igx + igy * ngx;
      SUNDlsMat_denseGETRS(P[ig], mp, pivot[ig], &(N_VGetArrayPointer(z)[iv]));
      iv += mp;
    }
  }

  return (0);
}